

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

void blowfish_ssh2_sdctr(ssh_cipher *cipher,void *blk,int len)

{
  int iVar1;
  long lVar2;
  uint32_t xL;
  uint xR;
  bool bVar3;
  uint32_t b [2];
  uint local_40;
  uint local_3c;
  ssh_cipher *local_38;
  
  if ((len & 7U) == 0) {
    xL = *(uint32_t *)&cipher[-1].vt;
    xR = *(uint *)((long)&cipher[-1].vt + 4);
    local_38 = cipher;
    if (0 < len) {
      lVar2 = (long)blk + 7;
      iVar1 = len + 8;
      do {
        blowfish_encrypt(xL,xR,&local_40,(BlowfishContext *)(cipher + -0x20a));
        *(uint *)(lVar2 + -7) =
             *(uint *)(lVar2 + -7) ^
             (local_40 >> 0x18 | (local_40 & 0xff0000) >> 8 | (local_40 & 0xff00) << 8 |
             local_40 << 0x18);
        *(uint *)(lVar2 + -3) =
             *(uint *)(lVar2 + -3) ^
             (local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
             local_3c << 0x18);
        bVar3 = 0xfffffffe < xR;
        xR = xR + 1;
        xL = xL + bVar3;
        lVar2 = lVar2 + 8;
        iVar1 = iVar1 + -8;
      } while (8 < iVar1);
    }
    *(uint32_t *)&local_38[-1].vt = xL;
    *(uint *)((long)&local_38[-1].vt + 4) = xR;
    return;
  }
  __assert_fail("(len & 7) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                ,0x1b5,"void blowfish_msb_sdctr(unsigned char *, int, BlowfishContext *)");
}

Assistant:

static void blowfish_ssh2_sdctr(ssh_cipher *cipher, void *blk, int len)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_msb_sdctr(blk, len, &ctx->context);
}